

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrent_echo_server.cpp
# Opt level: O3

void __thiscall fd_dispatcher::~fd_dispatcher(fd_dispatcher *this)

{
  std::vector<worker,_std::allocator<worker>_>::~vector(&this->m_workers);
  ranger::event::tcp_acceptor::~tcp_acceptor(&this->m_acc);
  ranger::event::dispatcher::~dispatcher(&this->m_disp);
  return;
}

Assistant:

fd_dispatcher(int port, size_t thread_cnt)
		: m_acc(m_disp, ranger::event::endpoint(port)) {
		m_acc.set_event_handler([this] (ranger::event::tcp_acceptor& acc, int fd) {
			return m_workers[m_worker_idx++ % m_workers.size()].take_fd(fd);
		});

		decltype(m_workers) workers(thread_cnt);
		for (auto i = workers.begin(); i != workers.end(); ++i) {
			auto conn_pair = ranger::event::tcp_connection::create_pair(m_disp, i->event_dispatcher());
			conn_pair.first.set_event_handler([] (ranger::event::tcp_connection& conn, ranger::event::tcp_connection::event_code what) {
				switch (what) {
				case ranger::event::tcp_connection::event_code::timeout:
				case ranger::event::tcp_connection::event_code::error:
				case ranger::event::tcp_connection::event_code::eof:
					conn.close();
					break;
				default:
					break;
				}
			});

			i->set_external_connection(std::move(conn_pair.first));
			i->set_internal_connection(std::move(conn_pair.second));
		}

		m_workers = std::move(workers);
	}